

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * lua_getupvalue(lua_State *L,int funcindex,int n)

{
  StkId pTVar1;
  int iVar2;
  TValue *fi;
  TValue *io2;
  TValue *io1;
  TValue *val;
  TString *usertype;
  char *pcStack_20;
  ravi_type_map type;
  char *name;
  int n_local;
  int funcindex_local;
  lua_State *L_local;
  
  io1 = (TValue *)0x0;
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  name._0_4_ = n;
  name._4_4_ = funcindex;
  _n_local = L;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x646,"const char *lua_getupvalue(lua_State *, int, int)");
  }
  fi = index2addr(L,funcindex);
  pcStack_20 = aux_upvalue(fi,(int)name,&io1,(CClosure **)0x0,(UpVal **)0x0,
                           (ravi_type_map *)((long)&usertype + 4),(TString **)&val);
  if (pcStack_20 != (char *)0x0) {
    pTVar1 = _n_local->top;
    pTVar1->value_ = io1->value_;
    pTVar1->tt_ = io1->tt_;
    if ((pTVar1->tt_ & 0x8000) != 0) {
      if ((pTVar1->tt_ & 0x8000) == 0) {
        __assert_fail("(((io1)->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x649,"const char *lua_getupvalue(lua_State *, int, int)");
      }
      if ((pTVar1->tt_ & 0x7f) != (ushort)((pTVar1->value_).gc)->tt) {
LAB_00119a87:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                      ,0x649,"const char *lua_getupvalue(lua_State *, int, int)");
      }
      if (_n_local != (lua_State *)0x0) {
        if ((pTVar1->tt_ & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                        ,0x649,"const char *lua_getupvalue(lua_State *, int, int)");
        }
        if ((((pTVar1->value_).gc)->marked & (_n_local->l_G->currentwhite ^ 0x18)) != 0)
        goto LAB_00119a87;
      }
    }
    _n_local->top = _n_local->top + 1;
    if (_n_local->ci->top < _n_local->top) {
      __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x64a,"const char *lua_getupvalue(lua_State *, int, int)");
    }
  }
  iVar2 = **(int **)&_n_local[-1].hookmask + -1;
  **(int **)&_n_local[-1].hookmask = iVar2;
  if (iVar2 == 0) {
    return pcStack_20;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x64c,"const char *lua_getupvalue(lua_State *, int, int)");
}

Assistant:

LUA_API const char *lua_getupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  ravi_type_map type;
  TString *usertype;
  TValue *val = NULL;  /* to avoid warnings */
  lua_lock(L);
  name = aux_upvalue(index2addr(L, funcindex), n, &val, NULL, NULL, &type, &usertype);
  if (name) {
    setobj2s(L, L->top, val);
    api_incr_top(L);
  }
  lua_unlock(L);
  return name;
}